

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

bool __thiscall cfd::core::Script::IsP2wpkhScript(Script *this)

{
  pointer pSVar1;
  bool bVar2;
  size_t sVar3;
  bool bVar4;
  void *local_20 [3];
  
  sVar3 = ByteData::GetDataSize(&this->script_data_);
  if ((((sVar3 == 0x16) &&
       (pSVar1 = (this->script_stack_).
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (long)(this->script_stack_).
             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 == 0xc0)) &&
      ((pSVar1->op_code_).data_type_ == ScriptOperator::OP_0._8_4_)) &&
     (pSVar1[1].type_ == kElementBinary)) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20,
               &pSVar1[1].binary_data_.data_);
    sVar3 = ByteData::GetDataSize((ByteData *)local_20);
    bVar4 = sVar3 == 0x14;
    bVar2 = true;
  }
  else {
    bVar2 = false;
    bVar4 = false;
  }
  if ((bVar2) && (local_20[0] != (void *)0x0)) {
    operator_delete(local_20[0]);
  }
  return bVar4;
}

Assistant:

bool Script::IsP2wpkhScript() const {
  return (
      script_data_.GetDataSize() == kScriptHashP2wpkhLength &&
      script_stack_.size() == 2 &&
      script_stack_[0].GetOpCode() == ScriptOperator::OP_0 &&
      script_stack_[1].IsBinary() &&
      script_stack_[1].GetBinaryData().GetDataSize() == kByteData160Length);
}